

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O2

void ScaleARGBRowDownEven_C
               (uint8_t *src_argb,ptrdiff_t src_stride,int src_stepx,uint8_t *dst_argb,int dst_width
               )

{
  uint32_t *dst;
  long lVar1;
  uint32_t *src;
  
  for (lVar1 = 0; (int)lVar1 < dst_width + -1; lVar1 = lVar1 + 2) {
    *(undefined4 *)(dst_argb + lVar1 * 4) = *(undefined4 *)src_argb;
    *(undefined4 *)(dst_argb + lVar1 * 4 + 4) = *(undefined4 *)(src_argb + (long)src_stepx * 4);
    src_argb = src_argb + (long)(src_stepx * 2) * 4;
  }
  if ((dst_width & 1U) != 0) {
    *(undefined4 *)(dst_argb + lVar1 * 4) = *(undefined4 *)src_argb;
  }
  return;
}

Assistant:

void ScaleARGBRowDownEven_C(const uint8_t* src_argb,
                            ptrdiff_t src_stride,
                            int src_stepx,
                            uint8_t* dst_argb,
                            int dst_width) {
  const uint32_t* src = (const uint32_t*)(src_argb);
  uint32_t* dst = (uint32_t*)(dst_argb);
  (void)src_stride;
  int x;
  for (x = 0; x < dst_width - 1; x += 2) {
    dst[0] = src[0];
    dst[1] = src[src_stepx];
    src += src_stepx * 2;
    dst += 2;
  }
  if (dst_width & 1) {
    dst[0] = src[0];
  }
}